

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

void __thiscall
helics::FederateState::setProperty(FederateState *this,int intProperty,int propertyVal)

{
  int iVar1;
  pointer this_00;
  int in_EDX;
  int in_ESI;
  size_t in_RDI;
  undefined4 in_stack_ffffffffffffffa8;
  int32_t in_stack_ffffffffffffffac;
  LogManager *in_stack_ffffffffffffffb0;
  LogManager *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffd0;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  if (in_ESI == 0x8f) {
    TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
              ((TimeRepresentation<count_time<9,_long>_> *)in_stack_ffffffffffffffb0,
               (double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    *(undefined8 *)(in_RDI + 0x2d8) = local_18;
  }
  else if (in_ESI == 0x90) {
    TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
              ((TimeRepresentation<count_time<9,_long>_> *)in_stack_ffffffffffffffb0,
               (double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    *(undefined8 *)(in_RDI + 0x2e0) = local_20;
  }
  else if (in_ESI == 0x91) {
    TimeRepresentation<count_time<9,_long>_>::TimeRepresentation
              ((TimeRepresentation<count_time<9,_long>_> *)in_stack_ffffffffffffffb0,
               (double)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8));
    *(undefined8 *)(in_RDI + 0x2d8) = local_28;
    *(undefined8 *)(in_RDI + 0x2e0) = *(undefined8 *)(in_RDI + 0x2d8);
  }
  else if ((in_ESI - 0x10fU < 2) || (in_ESI == 0x112)) {
    std::unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>::operator->
              ((unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_> *)0x4e2611)
    ;
    LogManager::setLogLevel(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffac);
    std::unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>::operator->
              ((unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_> *)0x4e262e)
    ;
    iVar1 = LogManager::getMaxLevel(in_stack_ffffffffffffffb8);
    *(int *)(in_RDI + 0x290) = iVar1;
  }
  else if (in_ESI == 0x114) {
    this_00 = std::unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>::
              operator->((unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_> *
                         )0x4e271b);
    LogManager::getLogBuffer(this_00);
    LogBuffer::resize((LogBuffer *)CONCAT44(in_ESI,in_stack_ffffffffffffffd0),in_RDI);
  }
  else if (in_ESI == 0x11a) {
    if (in_EDX < 0x11) {
      if (in_EDX < 0) {
        in_EDX = 0;
      }
    }
    else {
      in_EDX = 0x10;
    }
    *(int *)(in_RDI + 0x298) = in_EDX;
  }
  else {
    std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
    operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_> *
               )0x4e2761);
    TimeCoordinator::setProperty
              ((TimeCoordinator *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
               (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20),(int)in_stack_ffffffffffffffb8);
  }
  return;
}

Assistant:

void FederateState::setProperty(int intProperty, int propertyVal)
{
    switch (intProperty) {
        case defs::Properties::LOG_LEVEL:
        case defs::Properties::FILE_LOG_LEVEL:
        case defs::Properties::CONSOLE_LOG_LEVEL:
            mLogManager->setLogLevel(propertyVal);
            maxLogLevel = mLogManager->getMaxLevel();
            break;
        case defs::Properties::RT_LAG:
            rt_lag = helics::Time(static_cast<double>(propertyVal));
            break;
        case defs::Properties::INDEX_GROUP:
            indexGroup = (propertyVal > 16) ? 16 : ((propertyVal < 0) ? 0 : propertyVal);
            break;
        case defs::Properties::RT_LEAD:
            rt_lead = helics::Time(static_cast<double>(propertyVal));
            break;
        case defs::Properties::RT_TOLERANCE:
            rt_lag = helics::Time(static_cast<double>(propertyVal));
            rt_lead = rt_lag;
            break;
        case defs::Properties::LOG_BUFFER:
            mLogManager->getLogBuffer().resize(
                (propertyVal <= 0) ? 0UL : static_cast<std::size_t>(propertyVal));
            break;
        default:
            timeCoord->setProperty(intProperty, propertyVal);
    }
}